

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O3

void __thiscall SQCompilation::CodegenVisitor::visitUnExpr(CodegenVisitor *this,UnExpr *unary)

{
  SQOpcode op;
  
  maybeAddInExprLine(this,&unary->super_Expr);
  switch((unary->super_Expr).super_Node._op) {
  case TO_NOT:
    op = _OP_NOT;
    break;
  case TO_BNOT:
    op = _OP_BWNOT;
    break;
  case TO_NEG:
    op = _OP_NEG;
    break;
  case TO_TYPEOF:
    op = _OP_TYPEOF;
    break;
  case TO_RESUME:
    op = _OP_RESUME;
    break;
  case TO_CLONE:
    op = _OP_CLONE;
    break;
  case TO_PAREN:
    Node::visit<SQCompilation::CodegenVisitor>(&unary->_arg->super_Node,this);
    return;
  case TO_DELETE:
    emitDelete(this,unary);
    return;
  default:
    return;
  }
  emitUnaryOp(this,op,unary);
  return;
}

Assistant:

void CodegenVisitor::visitUnExpr(UnExpr *unary) {
    maybeAddInExprLine(unary);

    switch (unary->op())
    {
    case TO_NEG: emitUnaryOp(_OP_NEG, unary); break;
    case TO_NOT: emitUnaryOp(_OP_NOT, unary); break;
    case TO_BNOT:emitUnaryOp(_OP_BWNOT, unary); break;
    case TO_TYPEOF: emitUnaryOp(_OP_TYPEOF, unary); break;
    case TO_RESUME: emitUnaryOp(_OP_RESUME, unary); break;
    case TO_CLONE: emitUnaryOp(_OP_CLONE, unary); break;
    case TO_PAREN: unary->argument()->visit(this); break;
    case TO_DELETE: emitDelete(unary);
        break;
    default:
        break;
    }
}